

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O1

void __thiscall FIX::FieldMap::FieldMap(FieldMap *this,message_order *order,int size)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  int iVar3;
  atomic<long> *counter;
  
  this->_vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f8a68;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_fields).super__Vector_base<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar3 = order->m_delim;
  (this->m_order).m_mode = order->m_mode;
  (this->m_order).m_delim = iVar3;
  (this->m_order).m_groupOrder.m_size = (order->m_groupOrder).m_size;
  (this->m_order).m_groupOrder.m_buffer = (order->m_groupOrder).m_buffer;
  plVar2 = (long *)(order->m_groupOrder).m_buffer;
  if (plVar2 != (long *)0x0) {
    LOCK();
    *plVar2 = *plVar2 + 1;
    UNLOCK();
  }
  (this->m_order).m_largest = order->m_largest;
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::reserve(&this->m_fields,(long)size);
  return;
}

Assistant:

FieldMap::FieldMap(const message_order &order, int size)
    : m_order(order) {
  m_fields.reserve(size);
}